

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateOneNamespace
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *prefix,xmlNsPtr ns,
              xmlChar *value)

{
  _xmlDtd *p_Var1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  void *pvVar5;
  void *pvVar6;
  xmlChar *pxVar7;
  undefined8 *puVar8;
  long *plVar9;
  uint uVar10;
  xmlHashTablePtr pxVar11;
  char *pcVar12;
  xmlChar *pxVar13;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  if (ns == (xmlNsPtr)0x0 || elem->name == (xmlChar *)0x0) {
    return 0;
  }
  if (ns->href == (xmlChar *)0x0) {
    return 0;
  }
  if (prefix != (xmlChar *)0x0) {
    pxVar4 = xmlBuildQName(elem->name,prefix,fn,0x32);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      return 0;
    }
    p_Var1 = doc->intSubset;
    if (ns->prefix == (xmlChar *)0x0) {
      if (((p_Var1 == (_xmlDtd *)0x0) ||
          ((xmlHashTablePtr)p_Var1->attributes == (xmlHashTablePtr)0x0)) ||
         (pvVar5 = xmlHashLookup3((xmlHashTablePtr)p_Var1->attributes,"xmlns",(xmlChar *)0x0,pxVar4)
         , pvVar5 == (void *)0x0)) {
        if ((doc->extSubset != (_xmlDtd *)0x0) &&
           (pxVar11 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar11 != (xmlHashTablePtr)0x0))
        {
          pxVar13 = "xmlns";
          pxVar7 = (xmlChar *)0x0;
          goto LAB_00157d22;
        }
LAB_00157d2f:
        pvVar5 = (void *)0x0;
      }
    }
    else if (((p_Var1 == (_xmlDtd *)0x0) ||
             ((xmlHashTablePtr)p_Var1->attributes == (xmlHashTablePtr)0x0)) ||
            (pvVar5 = xmlHashLookup3((xmlHashTablePtr)p_Var1->attributes,ns->prefix,"xmlns",pxVar4),
            pvVar5 == (void *)0x0)) {
      if ((doc->extSubset == (_xmlDtd *)0x0) ||
         (pxVar11 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar11 == (xmlHashTablePtr)0x0))
      goto LAB_00157d2f;
      pxVar13 = ns->prefix;
      pxVar7 = "xmlns";
LAB_00157d22:
      pvVar5 = xmlHashLookup3(pxVar11,pxVar13,pxVar7,pxVar4);
    }
    if ((pxVar4 != fn) && (pxVar4 != elem->name)) {
      (*xmlFree)(pxVar4);
    }
    if (pvVar5 != (void *)0x0) goto LAB_00157e09;
  }
  p_Var1 = doc->intSubset;
  if (ns->prefix == (xmlChar *)0x0) {
    if (((p_Var1 != (_xmlDtd *)0x0) && ((xmlHashTablePtr)p_Var1->attributes != (xmlHashTablePtr)0x0)
        ) && (pvVar5 = xmlHashLookup3((xmlHashTablePtr)p_Var1->attributes,"xmlns",(xmlChar *)0x0,
                                      elem->name), pvVar5 != (void *)0x0)) goto LAB_00157e09;
    if ((doc->extSubset == (_xmlDtd *)0x0) ||
       (pxVar11 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar11 == (xmlHashTablePtr)0x0))
    goto LAB_00157e61;
    pxVar13 = elem->name;
    pxVar4 = "xmlns";
    pxVar7 = (xmlChar *)0x0;
  }
  else {
    if (((p_Var1 != (_xmlDtd *)0x0) && ((xmlHashTablePtr)p_Var1->attributes != (xmlHashTablePtr)0x0)
        ) && (pvVar5 = xmlHashLookup3((xmlHashTablePtr)p_Var1->attributes,ns->prefix,"xmlns",
                                      elem->name), pvVar5 != (void *)0x0)) goto LAB_00157e09;
    if ((doc->extSubset == (_xmlDtd *)0x0) ||
       (pxVar11 = (xmlHashTablePtr)doc->extSubset->attributes, pxVar11 == (xmlHashTablePtr)0x0))
    goto LAB_00157e61;
    pxVar4 = ns->prefix;
    pxVar13 = elem->name;
    pxVar7 = "xmlns";
  }
  pvVar5 = xmlHashLookup3(pxVar11,pxVar4,pxVar7,pxVar13);
  if (pvVar5 == (void *)0x0) {
LAB_00157e61:
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar13 = (xmlChar *)0x0;
      pcVar12 = "No declaration for attribute xmlns of element %s\n";
      pxVar4 = elem->name;
    }
    else {
      pcVar12 = "No declaration for attribute xmlns:%s of element %s\n";
      pxVar4 = ns->prefix;
      pxVar13 = elem->name;
    }
    xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_ATTRIBUTE,2,pxVar4,pxVar13,(xmlChar *)0x0,0,pcVar12,
                  pxVar4,pxVar13,0);
    return 0;
  }
LAB_00157e09:
  iVar2 = xmlValidateAttributeValueInternal(doc,*(xmlAttributeType *)((long)pvVar5 + 0x50),value);
  uVar10 = 1;
  if (iVar2 == 0) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar13 = (xmlChar *)0x0;
      pcVar12 = "Syntax of value for attribute xmlns of %s is not valid\n";
      pxVar4 = elem->name;
    }
    else {
      pcVar12 = "Syntax of value for attribute xmlns:%s of %s is not valid\n";
      pxVar4 = ns->prefix;
      pxVar13 = elem->name;
    }
    uVar10 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_INVALID_DEFAULT,2,pxVar4,pxVar13,(xmlChar *)0x0,0,pcVar12,pxVar4
                  ,pxVar13,0);
  }
  if ((*(int *)((long)pvVar5 + 0x54) == 4) &&
     (iVar2 = xmlStrEqual(value,*(xmlChar **)((long)pvVar5 + 0x58)), iVar2 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar7 = (xmlChar *)0x0;
      pcVar12 = "Value for attribute xmlns of %s is different from default \"%s\"\n";
      pxVar4 = elem->name;
      pxVar13 = *(xmlChar **)((long)pvVar5 + 0x58);
    }
    else {
      pcVar12 = "Value for attribute xmlns:%s of %s is different from default \"%s\"\n";
      pxVar4 = ns->prefix;
      pxVar13 = elem->name;
      pxVar7 = *(xmlChar **)((long)pvVar5 + 0x58);
    }
    uVar10 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_DEFAULT,2,pxVar4,pxVar13,pxVar7,0,pcVar12,pxVar4,
                  pxVar13,pxVar7);
  }
  iVar2 = *(int *)((long)pvVar5 + 0x50);
  if (iVar2 == 10) {
    puVar8 = *(undefined8 **)((long)pvVar5 + 0x60);
    if ((((doc->intSubset == (_xmlDtd *)0x0) ||
         (pxVar11 = (xmlHashTablePtr)doc->intSubset->notations, pxVar11 == (xmlHashTablePtr)0x0)) ||
        (pvVar6 = xmlHashLookup(pxVar11,value), pvVar6 == (void *)0x0)) &&
       (((doc->extSubset == (_xmlDtd *)0x0 ||
         (pxVar11 = (xmlHashTablePtr)doc->extSubset->notations, pxVar11 == (xmlHashTablePtr)0x0)) ||
        (pvVar6 = xmlHashLookup(pxVar11,value), pvVar6 == (void *)0x0)))) {
      if (ns->prefix == (xmlChar *)0x0) {
        pxVar13 = (xmlChar *)0x0;
        pcVar12 = "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n";
        pxVar4 = elem->name;
      }
      else {
        pcVar12 = "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n";
        pxVar4 = ns->prefix;
        pxVar13 = elem->name;
      }
      uVar10 = 0;
      xmlDoErrValid(ctxt,elem,XML_DTD_UNKNOWN_NOTATION,2,value,pxVar4,pxVar13,0,pcVar12,value,pxVar4
                    ,pxVar13);
    }
    for (; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
      iVar2 = xmlStrEqual((xmlChar *)puVar8[1],value);
      if (iVar2 != 0) goto LAB_0015812f;
    }
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar13 = (xmlChar *)0x0;
      pcVar12 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n";
      pxVar4 = elem->name;
    }
    else {
      pcVar12 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n";
      pxVar4 = ns->prefix;
      pxVar13 = elem->name;
    }
    uVar10 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_NOTATION_VALUE,2,value,pxVar4,pxVar13,0,pcVar12,value,pxVar4,
                  pxVar13);
LAB_0015812f:
    iVar2 = *(int *)((long)pvVar5 + 0x50);
  }
  if (iVar2 == 9) {
    plVar9 = (long *)((long)pvVar5 + 0x60);
    do {
      plVar9 = (long *)*plVar9;
      if (plVar9 == (long *)0x0) {
        if (ns->prefix == (xmlChar *)0x0) {
          pxVar13 = (xmlChar *)0x0;
          pcVar12 = "Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n";
          pxVar4 = elem->name;
        }
        else {
          pcVar12 = "Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n";
          pxVar4 = ns->prefix;
          pxVar13 = elem->name;
        }
        uVar10 = 0;
        xmlDoErrValid(ctxt,elem,XML_DTD_ATTRIBUTE_VALUE,2,value,pxVar4,pxVar13,0,pcVar12,value,
                      pxVar4,pxVar13);
        break;
      }
      iVar2 = xmlStrEqual((xmlChar *)plVar9[1],value);
    } while (iVar2 == 0);
  }
  if ((*(int *)((long)pvVar5 + 0x54) == 4) &&
     (iVar2 = xmlStrEqual(*(xmlChar **)((long)pvVar5 + 0x58),value), iVar2 == 0)) {
    if (ns->prefix == (xmlChar *)0x0) {
      pxVar7 = (xmlChar *)0x0;
      pcVar12 = "Value for attribute xmlns of %s must be \"%s\"\n";
      pxVar4 = elem->name;
      pxVar13 = *(xmlChar **)((long)pvVar5 + 0x58);
    }
    else {
      pcVar12 = "Value for attribute xmlns:%s of %s must be \"%s\"\n";
      pxVar4 = ns->prefix;
      pxVar13 = elem->name;
      pxVar7 = *(xmlChar **)((long)pvVar5 + 0x58);
    }
    uVar10 = 0;
    xmlDoErrValid(ctxt,elem,XML_DTD_ELEM_NAMESPACE,2,pxVar4,pxVar13,pxVar7,0,pcVar12,pxVar4,pxVar13,
                  pxVar7);
  }
  pxVar4 = "xmlns";
  if (ns->prefix != (xmlChar *)0x0) {
    pxVar4 = ns->prefix;
  }
  uVar3 = xmlValidateAttributeValue2
                    (ctxt,doc,pxVar4,*(xmlAttributeType *)((long)pvVar5 + 0x50),value);
  return uVar3 & uVar10;
}

Assistant:

int
xmlValidateOneNamespace(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
xmlNodePtr elem, const xmlChar *prefix, xmlNsPtr ns, const xmlChar *value) {
    /* xmlElementPtr elemDecl; */
    xmlAttributePtr attrDecl =  NULL;
    int val;
    int ret = 1;

    CHECK_DTD;
    if ((elem == NULL) || (elem->name == NULL)) return(0);
    if ((ns == NULL) || (ns->href == NULL)) return(0);

    if (prefix != NULL) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, prefix, fn, 50);
	if (fullname == NULL) {
	    xmlVErrMemory(ctxt);
	    return(0);
	}
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
					  ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullname,
                                          BAD_CAST "xmlns", NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullname,
                                              BAD_CAST "xmlns", NULL);
	}
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
		                          ns->prefix, BAD_CAST "xmlns");
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
					      ns->prefix, BAD_CAST "xmlns");
	} else {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, elem->name,
                                          BAD_CAST "xmlns", NULL);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, elem->name,
                                              BAD_CAST "xmlns", NULL);
	}
    }


    /* Validity Constraint: Attribute Value Type */
    if (attrDecl == NULL) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns:%s of element %s\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ATTRIBUTE,
		   "No declaration for attribute xmlns of element %s\n",
		   elem->name, NULL, NULL);
	}
	return(0);
    }

    val = xmlValidateAttributeValueInternal(doc, attrDecl->atype, value);
    if (val == 0) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns:%s of %s is not valid\n",
		   ns->prefix, elem->name, NULL);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_DEFAULT,
	       "Syntax of value for attribute xmlns of %s is not valid\n",
		   elem->name, NULL, NULL);
	}
        ret = 0;
    }

    /* Validity constraint: Fixed Attribute Default */
    if (attrDecl->def == XML_ATTRIBUTE_FIXED) {
	if (!xmlStrEqual(value, attrDecl->defaultValue)) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns:%s of %s is different from default \"%s\"\n",
		       ns->prefix, elem->name, attrDecl->defaultValue);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_DEFAULT,
       "Value for attribute xmlns of %s is different from default \"%s\"\n",
		       elem->name, attrDecl->defaultValue, NULL);
	    }
	    ret = 0;
	}
    }

    /* Validity Constraint: Notation Attributes */
    if (attrDecl->atype == XML_ATTRIBUTE_NOTATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
        xmlNotationPtr nota;

        /* First check that the given NOTATION was declared */
	nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	if (nota == NULL)
	    nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	if (nota == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns:%s of %s is not a declared Notation\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_NOTATION,
       "Value \"%s\" for attribute xmlns of %s is not a declared Notation\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
        }

	/* Second, verify that it's among the list */
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated notations\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOTATION_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated notations\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Validity Constraint: Enumeration */
    if (attrDecl->atype == XML_ATTRIBUTE_ENUMERATION) {
        xmlEnumerationPtr tree = attrDecl->tree;
	while (tree != NULL) {
	    if (xmlStrEqual(tree->name, value)) break;
	    tree = tree->next;
	}
	if (tree == NULL) {
	    if (ns->prefix != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns:%s of %s is not among the enumerated set\n",
		       value, ns->prefix, elem->name);
	    } else {
		xmlErrValidNode(ctxt, elem, XML_DTD_ATTRIBUTE_VALUE,
"Value \"%s\" for attribute xmlns of %s is not among the enumerated set\n",
		       value, elem->name, NULL);
	    }
	    ret = 0;
	}
    }

    /* Fixed Attribute Default */
    if ((attrDecl->def == XML_ATTRIBUTE_FIXED) &&
        (!xmlStrEqual(attrDecl->defaultValue, value))) {
	if (ns->prefix != NULL) {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns:%s of %s must be \"%s\"\n",
		   ns->prefix, elem->name, attrDecl->defaultValue);
	} else {
	    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Value for attribute xmlns of %s must be \"%s\"\n",
		   elem->name, attrDecl->defaultValue, NULL);
	}
        ret = 0;
    }

    /* Extra check for the attribute value */
    if (ns->prefix != NULL) {
	ret &= xmlValidateAttributeValue2(ctxt, doc, ns->prefix,
					  attrDecl->atype, value);
    } else {
	ret &= xmlValidateAttributeValue2(ctxt, doc, BAD_CAST "xmlns",
					  attrDecl->atype, value);
    }

    return(ret);
}